

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O3

void Fxu_UpdateDoublePairs(Fxu_Matrix *p,Fxu_Double *pDouble,Fxu_Var *pVar)

{
  uint uVar1;
  Fxu_Pair **ppP1;
  char *pItem;
  Fxu_Cube *pCube;
  Fxu_Cube *pCube_00;
  Fxu_Var *pFVar2;
  Fxu_Lit *pFVar3;
  int iVar4;
  void **ppvVar5;
  Fxu_Lit *pFVar6;
  Fxu_Lit *pFVar7;
  Vec_Ptr_t *pVVar8;
  Fxu_Lit *pFVar9;
  Fxu_Pair *pFVar10;
  Fxu_Lit *pLit;
  Fxu_Lit *pLit_00;
  long lVar11;
  
  pVVar8 = p->vPairs;
  pVVar8->nSize = 0;
  pFVar10 = (pDouble->lPairs).pHead;
  if (pFVar10 != (Fxu_Pair *)0x0) {
    do {
      pVVar8 = p->vPairs;
      uVar1 = pVVar8->nSize;
      if (uVar1 == pVVar8->nCap) {
        if ((int)uVar1 < 0x10) {
          if (pVVar8->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar8->pArray,0x80);
          }
          pVVar8->pArray = ppvVar5;
          pVVar8->nCap = 0x10;
        }
        else {
          if (pVVar8->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar8->pArray,(ulong)uVar1 << 4);
          }
          pVVar8->pArray = ppvVar5;
          pVVar8->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar5 = pVVar8->pArray;
      }
      iVar4 = pVVar8->nSize;
      pVVar8->nSize = iVar4 + 1;
      ppvVar5[iVar4] = pFVar10;
      pFVar10 = pFVar10->pDNext;
    } while (pFVar10 != (Fxu_Pair *)0x0);
    pVVar8 = p->vPairs;
    iVar4 = pVVar8->nSize;
    if (1 < (long)iVar4) {
      qsort(pVVar8->pArray,(long)iVar4,8,Fxu_UpdatePairCompare);
      ppP1 = (Fxu_Pair **)p->vPairs->pArray;
      iVar4 = Fxu_UpdatePairCompare(ppP1,ppP1 + (long)p->vPairs->nSize + -1);
      if (-1 < iVar4) {
        __assert_fail("Fxu_UpdatePairCompare( (Fxu_Pair**)p->vPairs->pArray, (Fxu_Pair**)p->vPairs->pArray + p->vPairs->nSize - 1 ) < 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuUpdate.c"
                      ,0x251,"void Fxu_UpdatePairsSort(Fxu_Matrix *, Fxu_Double *)");
      }
      pVVar8 = p->vPairs;
      iVar4 = pVVar8->nSize;
    }
    if (0 < iVar4) {
      lVar11 = 0;
      do {
        pItem = (char *)pVVar8->pArray[lVar11];
        pCube = *(Fxu_Cube **)
                 (pItem + (ulong)(*(int *)(pItem + 0x2c) <= *(int *)(pItem + 0x28)) * 8 + 0x18);
        if (pCube->pOrder != (Fxu_Cube *)0x0) {
          __assert_fail("pCubeUse->pOrder == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuUpdate.c"
                        ,0x12f,"void Fxu_UpdateDoublePairs(Fxu_Matrix *, Fxu_Double *, Fxu_Var *)");
        }
        pCube_00 = *(Fxu_Cube **)
                    (pItem + (ulong)(*(int *)(pItem + 0x28) <= *(int *)(pItem + 0x2c)) * 8 + 0x18);
        *p->ppTailCubes = pCube;
        p->ppTailCubes = &pCube->pOrder;
        pCube->pOrder = (Fxu_Cube *)0x1;
        pLit = (pCube->lLits).pHead;
        if (pLit == (Fxu_Lit *)0x0) {
          pFVar6 = (Fxu_Lit *)0x0;
        }
        else {
          pFVar6 = pLit->pHNext;
        }
        pLit_00 = (pCube_00->lLits).pHead;
        if (pLit_00 == (Fxu_Lit *)0x0) {
          pFVar3 = (Fxu_Lit *)0x0;
        }
        else {
          pFVar3 = pLit_00->pHNext;
        }
        while( true ) {
          while( true ) {
            while ((pFVar9 = pFVar3, pFVar7 = pFVar6, pFVar6 = pFVar7, pFVar3 = pFVar9,
                   pLit != (Fxu_Lit *)0x0 && (pLit_00 != (Fxu_Lit *)0x0))) {
              if (pLit->iVar == pLit_00->iVar) {
                if (pLit->pVar->pOrder == (Fxu_Var *)0x0) {
                  *p->ppTailVars = pLit->pVar;
                  pFVar2 = pLit->pVar;
                  p->ppTailVars = &pFVar2->pOrder;
                  pFVar2->pOrder = (Fxu_Var *)0x1;
                }
                Fxu_MatrixDelLiteral(p,pLit_00);
                if (pFVar7 == (Fxu_Lit *)0x0) {
                  pFVar6 = (Fxu_Lit *)0x0;
                }
                else {
                  pFVar6 = pFVar7->pHNext;
                }
                pFVar3 = (Fxu_Lit *)0x0;
                pLit = pFVar7;
                pLit_00 = (Fxu_Lit *)0x0;
                if (pFVar9 != (Fxu_Lit *)0x0) {
                  pFVar3 = pFVar9->pHNext;
                  pLit_00 = pFVar9;
                }
              }
              else if (pLit->iVar < pLit_00->iVar) {
                if (pLit->pVar->pOrder == (Fxu_Var *)0x0) {
                  *p->ppTailVars = pLit->pVar;
                  pFVar2 = pLit->pVar;
                  p->ppTailVars = &pFVar2->pOrder;
                  pFVar2->pOrder = (Fxu_Var *)0x1;
                }
                Fxu_MatrixDelLiteral(p,pLit);
                pFVar6 = (Fxu_Lit *)0x0;
                pLit = (Fxu_Lit *)0x0;
                if (pFVar7 != (Fxu_Lit *)0x0) {
                  pFVar6 = pFVar7->pHNext;
                  pLit = pFVar7;
                }
              }
              else {
                if (pLit_00->pVar->pOrder == (Fxu_Var *)0x0) {
                  *p->ppTailVars = pLit_00->pVar;
                  pFVar2 = pLit_00->pVar;
                  p->ppTailVars = &pFVar2->pOrder;
                  pFVar2->pOrder = (Fxu_Var *)0x1;
                }
                Fxu_MatrixDelLiteral(p,pLit_00);
                pFVar3 = (Fxu_Lit *)0x0;
                pLit_00 = (Fxu_Lit *)0x0;
                if (pFVar9 != (Fxu_Lit *)0x0) {
                  pFVar3 = pFVar9->pHNext;
                  pLit_00 = pFVar9;
                }
              }
            }
            if ((pLit == (Fxu_Lit *)0x0) || (pLit_00 != (Fxu_Lit *)0x0)) break;
            if (pLit->pVar->pOrder == (Fxu_Var *)0x0) {
              *p->ppTailVars = pLit->pVar;
              pFVar2 = pLit->pVar;
              p->ppTailVars = &pFVar2->pOrder;
              pFVar2->pOrder = (Fxu_Var *)0x1;
            }
            Fxu_MatrixDelLiteral(p,pLit);
            pFVar6 = (Fxu_Lit *)0x0;
            pLit = (Fxu_Lit *)0x0;
            pLit_00 = (Fxu_Lit *)0x0;
            if (pFVar7 != (Fxu_Lit *)0x0) {
              pFVar6 = pFVar7->pHNext;
              pLit = pFVar7;
              pLit_00 = (Fxu_Lit *)0x0;
            }
          }
          if ((pLit != (Fxu_Lit *)0x0) || (pLit_00 == (Fxu_Lit *)0x0)) break;
          if (pLit_00->pVar->pOrder == (Fxu_Var *)0x0) {
            *p->ppTailVars = pLit_00->pVar;
            pFVar2 = pLit_00->pVar;
            p->ppTailVars = &pFVar2->pOrder;
            pFVar2->pOrder = (Fxu_Var *)0x1;
          }
          Fxu_MatrixDelLiteral(p,pLit_00);
          pLit = (Fxu_Lit *)0x0;
          pFVar3 = (Fxu_Lit *)0x0;
          pLit_00 = (Fxu_Lit *)0x0;
          if (pFVar9 != (Fxu_Lit *)0x0) {
            pLit = (Fxu_Lit *)0x0;
            pFVar3 = pFVar9->pHNext;
            pLit_00 = pFVar9;
          }
        }
        Fxu_MatrixAddLiteral(p,pCube,pVar);
        if ((pCube->lLits).nItems != *(int *)(pItem + 8) + 1) {
          __assert_fail("pCubeUse->lLits.nItems == pPair->nBase + 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuUpdate.c"
                        ,0x137,"void Fxu_UpdateDoublePairs(Fxu_Matrix *, Fxu_Double *, Fxu_Var *)");
        }
        if ((pCube_00->lLits).nItems != 0) {
          __assert_fail("pCubeRem->lLits.nItems == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuUpdate.c"
                        ,0x138,"void Fxu_UpdateDoublePairs(Fxu_Matrix *, Fxu_Double *, Fxu_Var *)");
        }
        Fxu_UpdateCleanOldDoubles(p,pDouble,pCube);
        Fxu_UpdateCleanOldDoubles(p,pDouble,pCube_00);
        Fxu_MemRecycle(p,pItem,0x40);
        lVar11 = lVar11 + 1;
        pVVar8 = p->vPairs;
      } while (lVar11 < pVVar8->nSize);
    }
  }
  pVVar8->nSize = 0;
  return;
}

Assistant:

void Fxu_UpdateDoublePairs( Fxu_Matrix * p, Fxu_Double * pDouble, Fxu_Var * pVar )
{
    Fxu_Pair * pPair;
    Fxu_Cube * pCubeUse, * pCubeRem;
    int i;

    // collect and sort the pairs
    Fxu_UpdatePairsSort( p, pDouble );
//    for ( i = 0; i < p->nPairsTemp; i++ )
    for ( i = 0; i < p->vPairs->nSize; i++ )
    {
        // get the pair
//        pPair = p->pPairsTemp[i];
        pPair = (Fxu_Pair *)p->vPairs->pArray[i];
        // out of the two cubes, select the one which comes earlier
        pCubeUse = Fxu_PairMinCube( pPair );
        pCubeRem = Fxu_PairMaxCube( pPair );
        // collect the affected cube
        assert( pCubeUse->pOrder == NULL );
        Fxu_MatrixRingCubesAdd( p, pCubeUse );

        // remove some literals from pCubeUse and all literals from pCubeRem
        Fxu_UpdateMatrixDoubleClean( p, pCubeUse, pCubeRem );
        // add a literal that depends on the new variable
        Fxu_MatrixAddLiteral( p, pCubeUse, pVar );    
        // check the literal count
        assert( pCubeUse->lLits.nItems == pPair->nBase + 1 );
        assert( pCubeRem->lLits.nItems == 0 );

        // update the divisors by removing useless pairs
        Fxu_UpdateCleanOldDoubles( p, pDouble, pCubeUse );
        Fxu_UpdateCleanOldDoubles( p, pDouble, pCubeRem );
        // remove the pair
        MEM_FREE_FXU( p, Fxu_Pair, 1, pPair );
    }
    p->vPairs->nSize = 0;
}